

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

bool __thiscall
replay_entry_t::match(replay_entry_t *this,ped_type_t type,__cilkrts_pedigree *node,int victim)

{
  bool bVar1;
  bool local_32;
  int i;
  int victim_local;
  __cilkrts_pedigree *node_local;
  ped_type_t type_local;
  replay_entry_t *this_local;
  
  i = 0;
  if ((type == this->m_type) &&
     ((node_local = node, type != ped_type_steal || (victim == this->m_value)))) {
    while( true ) {
      bVar1 = false;
      if (node_local != (__cilkrts_pedigree *)0x0) {
        bVar1 = i < this->m_pedigree_len;
      }
      if (!bVar1) {
        local_32 = false;
        if (node_local == (__cilkrts_pedigree *)0x0) {
          local_32 = i == this->m_pedigree_len;
        }
        return local_32;
      }
      if (node_local->rank != this->m_reverse_pedigree[i]) break;
      node_local = node_local->parent;
      i = i + 1;
    }
  }
  return false;
}

Assistant:

bool match (ped_type_t type, const __cilkrts_pedigree *node, int victim = -1)
    {
        int i = 0;

        // If the type isn't what they're seeking, we don't have a match
        if (type != m_type)
            return false;

        // If we're looking for a STEAL, then the victim must match
        if ((type == ped_type_steal) && (victim != m_value))
            return false;

        // Compare the current pedigree against what was recorded
        while ((NULL != node) && (i < m_pedigree_len))
        {
            // If we've got a pedigree rank difference, then we don't have
            // a match
            if (node->rank != m_reverse_pedigree[i])
                return false;
            node = node->parent;
            i++;
        }

        // Make sure we exhausted both the pedigree chain and the recorded
        // pedigree
        return ((NULL == node) && (i == m_pedigree_len));
    }